

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_key.cpp
# Opt level: O0

void __thiscall cfdcapi_key_ExtkeyTest_Test::TestBody(cfdcapi_key_ExtkeyTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  char *str_buffer;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  char *get_extkey;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  int key_type;
  int net_type;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  uint32_t child_number;
  uint32_t depth;
  char *chain_code;
  char *fingerprint;
  char *version;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *key_path_data;
  char *extpubkey1;
  char *extprivkey4;
  char *extprivkey3;
  char *extprivkey2;
  char *extprivkey1;
  char *wif;
  char *privkey;
  char *pubkey;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffff718;
  AssertionResult *in_stack_fffffffffffff720;
  undefined4 uVar4;
  int *piVar3;
  CfdErrorCode *in_stack_fffffffffffff728;
  CfdExtKeyType *lhs;
  undefined4 uVar5;
  CfdErrorCode *lhs_00;
  char **in_stack_fffffffffffff730;
  char **rhs_expression;
  char **in_stack_fffffffffffff738;
  char **in_stack_fffffffffffff740;
  AssertionResult *pAVar6;
  undefined7 in_stack_fffffffffffff748;
  undefined1 in_stack_fffffffffffff74f;
  void *in_stack_fffffffffffff750;
  void *in_stack_fffffffffffff758;
  undefined7 in_stack_fffffffffffff760;
  undefined1 in_stack_fffffffffffff767;
  char **in_stack_fffffffffffff7b0;
  AssertionResult *in_stack_fffffffffffff7b8;
  char **in_stack_fffffffffffff8a0;
  undefined8 in_stack_fffffffffffff8a8;
  int network_type;
  int in_stack_fffffffffffff8b0;
  int in_stack_fffffffffffff8b4;
  void *in_stack_fffffffffffff8b8;
  char **in_stack_fffffffffffff8c0;
  int in_stack_fffffffffffff8c8;
  int in_stack_fffffffffffff8cc;
  char *in_stack_fffffffffffff8d0;
  char **in_stack_fffffffffffff8d8;
  int in_stack_fffffffffffff8e0;
  int in_stack_fffffffffffff8e4;
  char *in_stack_fffffffffffff8e8;
  char *in_stack_fffffffffffff8f0;
  undefined7 in_stack_fffffffffffff8f8;
  undefined1 in_stack_fffffffffffff8ff;
  char **in_stack_fffffffffffff908;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  undefined8 in_stack_fffffffffffff918;
  int network_type_00;
  char *in_stack_fffffffffffff920;
  undefined7 in_stack_fffffffffffff928;
  undefined1 in_stack_fffffffffffff92f;
  AssertHelper local_5a0;
  Message local_598;
  undefined4 local_58c;
  AssertionResult local_588;
  AssertHelper local_578;
  Message local_570;
  AssertionResult local_568;
  AssertHelper local_558;
  Message local_550;
  undefined4 local_544;
  AssertionResult local_540;
  uint32_t *in_stack_fffffffffffffad0;
  AssertHelper in_stack_fffffffffffffad8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffae0;
  char **in_stack_fffffffffffffae8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffaf0;
  AssertHelper in_stack_fffffffffffffaf8;
  Message local_500;
  undefined4 local_4f4;
  uint32_t *in_stack_fffffffffffffb10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb18;
  AssertHelper in_stack_fffffffffffffb20;
  Message local_4d8;
  AssertionResult local_4d0;
  AssertHelper local_4c0;
  Message local_4b8;
  undefined4 local_4ac;
  AssertionResult local_4a8;
  char *local_498;
  AssertHelper local_490;
  Message local_488;
  undefined4 local_47c;
  AssertionResult local_478;
  AssertHelper local_468;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  int in_stack_fffffffffffffbb4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbb8;
  AssertHelper in_stack_fffffffffffffbc0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbc8;
  AssertionResult local_428;
  int local_418 [2];
  AssertHelper local_410;
  Message local_408;
  undefined4 local_3fc;
  AssertionResult local_3f8;
  AssertHelper local_3e8;
  Message local_3e0;
  undefined4 local_3d4;
  AssertionResult local_3d0;
  AssertHelper local_3c0;
  Message local_3b8;
  AssertionResult local_3b0;
  AssertHelper local_3a0;
  Message local_398;
  AssertionResult local_390;
  AssertHelper local_380;
  Message local_378;
  AssertionResult local_370;
  AssertHelper local_360;
  Message local_358;
  undefined4 local_34c;
  AssertionResult local_348;
  undefined4 local_338;
  undefined4 local_334;
  char *local_330;
  char *local_328;
  char *local_320;
  AssertHelper local_318;
  Message local_310;
  AssertionResult local_308;
  AssertHelper local_2f8;
  Message local_2f0;
  AssertionResult local_2e8;
  AssertHelper in_stack_fffffffffffffd28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  int in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd48;
  AssertHelper local_2b0;
  Message local_2a8;
  char *in_stack_fffffffffffffd60;
  uchar in_stack_fffffffffffffd68;
  uint32_t in_stack_fffffffffffffd70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd78;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  AssertionResult local_258;
  AssertHelper local_248;
  Message local_240;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  AssertionResult local_1f0;
  AssertHelper local_1e0;
  Message local_1d8;
  undefined4 local_1cc;
  AssertionResult local_1c8;
  AssertHelper local_1b8;
  Message local_1b0;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  undefined4 local_184;
  AssertionResult local_180;
  AssertHelper local_170;
  Message local_168;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  undefined4 local_13c;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  AssertionResult local_118;
  AssertHelper local_108;
  Message local_100;
  undefined4 local_f4;
  AssertionResult local_f0;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  network_type = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
  network_type_00 = (int)((ulong)in_stack_fffffffffffff918 >> 0x20);
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffff738);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
             in_stack_fffffffffffff728,(int *)in_stack_fffffffffffff720);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36caba);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x23f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x36cb1d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36cb72);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff720,in_stack_fffffffffffff718,(type *)0x36cba6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x240,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x36cca2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36cd1d);
  local_a0 = (char *)0x0;
  local_a8 = (char *)0x0;
  local_b0 = (char *)0x0;
  local_b8 = (char *)0x0;
  local_c0 = (char *)0x0;
  local_c8 = (char *)0x0;
  local_d0 = (char *)0x0;
  local_d8 = (char *)0x0;
  local_e0 = (char *)0x0;
  local_14 = CfdCreateExtkeyFromSeed
                       (in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                        in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,
                        in_stack_fffffffffffff8c0);
  local_f4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
             in_stack_fffffffffffff728,(int *)in_stack_fffffffffffff720);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36ce5d);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x250,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message((Message *)0x36cec0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36cf15);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_118,
               "\"xprv9s21ZrQH143K38XAstQ4D3hCGbgydJgNff6CcwmkrWTBxksb2G4CsqAywJCKbTdywfCpmpJyxqf77iKK1ju1J982iP2PriifaNZLMbyPQCx\""
               ,"extprivkey1",
               "xprv9s21ZrQH143K38XAstQ4D3hCGbgydJgNff6CcwmkrWTBxksb2G4CsqAywJCKbTdywfCpmpJyxqf77iKK1ju1J982iP2PriifaNZLMbyPQCx"
               ,local_b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36cfc4);
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x252,pcVar2);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::Message::~Message((Message *)0x36d027);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36d07f);
    local_14 = CfdCreateExtkeyFromParent
                         ((void *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                          (char *)in_stack_fffffffffffff8c0,
                          (uint32_t)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
                          SUB81((ulong)in_stack_fffffffffffff8b8 >> 0x18,0),
                          in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0,
                          (char **)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    local_13c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
               in_stack_fffffffffffff728,(int *)in_stack_fffffffffffff720);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36d166);
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x256,pcVar2);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      testing::Message::~Message((Message *)0x36d1c9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36d21e);
  }
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_160,
               "\"xprv9tviYANkXM1CY831VtMFKFn6LP6aMHf1kvtCZyTL9YbyMwTR2BSmJaEoqw59BZdQhLSx9ZxyKsRUeCetxA2xZ34eupBqZUsifnWyLJJ16j3\""
               ,"extprivkey2",
               "xprv9tviYANkXM1CY831VtMFKFn6LP6aMHf1kvtCZyTL9YbyMwTR2BSmJaEoqw59BZdQhLSx9ZxyKsRUeCetxA2xZ34eupBqZUsifnWyLJJ16j3"
               ,local_c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36d2cf);
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x259,pcVar2);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      testing::Message::~Message((Message *)0x36d332);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36d38a);
    local_14 = CfdCreateExtPubkey(in_stack_fffffffffffff8b8,
                                  (char *)CONCAT44(in_stack_fffffffffffff8b4,
                                                   in_stack_fffffffffffff8b0),network_type,
                                  in_stack_fffffffffffff8a0);
    local_184 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
               in_stack_fffffffffffff728,(int *)in_stack_fffffffffffff720);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36d45d);
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x25d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_198,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      testing::Message::~Message((Message *)0x36d4c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36d515);
  }
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1a8,
               "\"xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2\""
               ,"extpubkey1",
               "xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2"
               ,local_d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36d5c6);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x260,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      testing::Message::~Message((Message *)0x36d629);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36d681);
    local_14 = CfdCreateExtkeyFromParentPath
                         ((void *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8),
                          in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                          in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0,
                          in_stack_fffffffffffff8d8);
    local_1cc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
               in_stack_fffffffffffff728,(int *)in_stack_fffffffffffff720);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
    if (!bVar1) {
      testing::Message::Message(&local_1d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36d75f);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x264,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1e0);
      testing::Message::~Message((Message *)0x36d7c2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36d817);
  }
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1f0,
               "\"xprvA1YYKkMiZaDHRY4dmXjcP3js7ATJQAwt9gozTvi69etziyBAAENQN4w7sS3uBaF7rgXvP3sUtKFju7p3PosjNkRDuqqSFfxTjjEhgx6ejVZ\""
               ,"extprivkey3",
               "xprvA1YYKkMiZaDHRY4dmXjcP3js7ATJQAwt9gozTvi69etziyBAAENQN4w7sS3uBaF7rgXvP3sUtKFju7p3PosjNkRDuqqSFfxTjjEhgx6ejVZ"
               ,local_c8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
    if (!bVar1) {
      testing::Message::Message(&local_1f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36d8c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x267,pcVar2);
      testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      testing::Message::~Message((Message *)0x36d92b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36d983);
    local_14 = CfdGetPrivkeyFromExtkey
                         ((void *)CONCAT17(in_stack_fffffffffffff92f,in_stack_fffffffffffff928),
                          in_stack_fffffffffffff920,network_type_00,
                          (char **)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                          in_stack_fffffffffffff908);
    local_214 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
               in_stack_fffffffffffff728,(int *)in_stack_fffffffffffff720);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36da5e);
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x26b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      testing::Message::~Message((Message *)0x36dac1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36db16);
  }
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_238,
               "\"597da1afc4218445ba9428c1c790a30fd21d5c4a932fa580b99dda7ec0887472\"","privkey",
               "597da1afc4218445ba9428c1c790a30fd21d5c4a932fa580b99dda7ec0887472",local_a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
    if (!bVar1) {
      testing::Message::Message(&local_240);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36dbc7);
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x26e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_248,&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      testing::Message::~Message((Message *)0x36dc2a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36dc7f);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_258,"\"KzDfmSzt1XqZh5m4sQPBqhpiTGncQ2xvXuWnKGMqR9gVHGSbVJP2\"",
               "wif","KzDfmSzt1XqZh5m4sQPBqhpiTGncQ2xvXuWnKGMqR9gVHGSbVJP2",local_b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36dd20);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x26f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message((Message *)0x36dd83);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36dddb);
    local_14 = CfdGetPubkeyFromExtkey
                         (in_stack_fffffffffffff8b8,
                          (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                          network_type,in_stack_fffffffffffff8a0);
    pAVar6 = &local_278;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
               in_stack_fffffffffffff728,(int *)in_stack_fffffffffffff720);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd78);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36deae);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x273,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd70,(Message *)&stack0xfffffffffffffd78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd70);
      testing::Message::~Message((Message *)0x36df11);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36df66);
  }
  if (local_14 == 0) {
    pAVar6 = (AssertionResult *)&stack0xfffffffffffffd60;
    testing::internal::CmpHelperSTREQ
              ((internal *)pAVar6,
               "\"031d7463018f867de51a27db866f869ceaf52abab71827a6051bab8a0fd020f4c1\"","pubkey",
               "031d7463018f867de51a27db866f869ceaf52abab71827a6051bab8a0fd020f4c1",local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
    if (!bVar1) {
      testing::Message::Message(&local_2a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36e017);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x276,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
      testing::internal::AssertHelper::~AssertHelper(&local_2b0);
      testing::Message::~Message((Message *)0x36e07a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e0d2);
    local_14 = CfdGetParentExtkeyPathData
                         (in_stack_fffffffffffffbc8.ptr_,(char *)in_stack_fffffffffffffbc0.data_,
                          (char *)in_stack_fffffffffffffbb8.ptr_,in_stack_fffffffffffffbb4,
                          (char **)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                          (char **)in_stack_fffffffffffffba0.ptr_);
    in_stack_fffffffffffffd3c = 0;
    pAVar6 = (AssertionResult *)&stack0xfffffffffffffd40;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
               in_stack_fffffffffffff728,(int *)in_stack_fffffffffffff720);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd30);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36e1b4);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x27a,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd28,(Message *)&stack0xfffffffffffffd30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd28);
      testing::Message::~Message((Message *)0x36e217);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e26c);
  }
  if (local_14 == 0) {
    pAVar6 = &local_2e8;
    testing::internal::CmpHelperSTREQ
              ((internal *)pAVar6,"\"[03af54a0/0h/0h/2]\"","key_path_data","[03af54a0/0h/0h/2]",
               local_e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
    if (!bVar1) {
      testing::Message::Message(&local_2f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36e31d);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x27d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
      testing::internal::AssertHelper::~AssertHelper(&local_2f8);
      testing::Message::~Message((Message *)0x36e380);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e3d5);
    pAVar6 = &local_308;
    testing::internal::CmpHelperSTREQ
              ((internal *)pAVar6,"extprivkey3","extprivkey4",local_c8,local_d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
    if (!bVar1) {
      testing::Message::Message(&local_310);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36e477);
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x27e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_318,&local_310);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      testing::Message::~Message((Message *)0x36e4da);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e532);
    local_320 = (char *)0x0;
    local_328 = (char *)0x0;
    local_330 = (char *)0x0;
    local_334 = 0;
    local_338 = 0;
    local_14 = CfdGetExtkeyInformation
                         (in_stack_fffffffffffff750,
                          (char *)CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748),
                          in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                          in_stack_fffffffffffff730,(uint32_t *)in_stack_fffffffffffff728,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760))
    ;
    local_34c = 0;
    pAVar6 = &local_348;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
               in_stack_fffffffffffff728,(int *)in_stack_fffffffffffff720);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
    if (!bVar1) {
      testing::Message::Message(&local_358);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36e663);
      testing::internal::AssertHelper::AssertHelper
                (&local_360,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x287,pcVar2);
      testing::internal::AssertHelper::operator=(&local_360,&local_358);
      testing::internal::AssertHelper::~AssertHelper(&local_360);
      testing::Message::~Message((Message *)0x36e6c6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e71b);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_370,"\"0488ade4\"","version","0488ade4",local_320);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_370);
      if (!bVar1) {
        testing::Message::Message(&local_378);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36e7ca);
        testing::internal::AssertHelper::AssertHelper
                  (&local_380,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x289,pcVar2);
        testing::internal::AssertHelper::operator=(&local_380,&local_378);
        testing::internal::AssertHelper::~AssertHelper(&local_380);
        testing::Message::~Message((Message *)0x36e82d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e882);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_390,"\"8806118d\"","fingerprint","8806118d",local_328);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_390);
      if (!bVar1) {
        testing::Message::Message(&local_398);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36e923);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x28a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
        testing::internal::AssertHelper::~AssertHelper(&local_3a0);
        testing::Message::~Message((Message *)0x36e986);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e9db);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_3b0,
                 "\"a3d58c40ac9c588529edb6cf9576241a6c2c919843bd97c3c26b35538d91a292\"","chain_code"
                 ,"a3d58c40ac9c588529edb6cf9576241a6c2c919843bd97c3c26b35538d91a292",local_330);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
      if (!bVar1) {
        testing::Message::Message(&local_3b8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36ea7c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x28b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
        testing::internal::AssertHelper::~AssertHelper(&local_3c0);
        testing::Message::~Message((Message *)0x36eadf);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36eb34);
      local_3d4 = 4;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
                 in_stack_fffffffffffff728,(uint *)in_stack_fffffffffffff720);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d0);
      if (!bVar1) {
        testing::Message::Message(&local_3e0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36ebe1);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x28c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
        testing::internal::AssertHelper::~AssertHelper(&local_3e8);
        testing::Message::~Message((Message *)0x36ec44);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36ec99);
      local_3fc = 2;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
                 in_stack_fffffffffffff728,(uint *)in_stack_fffffffffffff720);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
      if (!bVar1) {
        testing::Message::Message(&local_408);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36ed46);
        testing::internal::AssertHelper::AssertHelper
                  (&local_410,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x28d,pcVar2);
        testing::internal::AssertHelper::operator=(&local_410,&local_408);
        testing::internal::AssertHelper::~AssertHelper(&local_410);
        testing::Message::~Message((Message *)0x36eda9);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36ee01);
      local_418[1] = 0;
      local_418[0] = 0;
      lhs = (CfdExtKeyType *)(local_418 + 1);
      piVar3 = local_418;
      local_14 = CfdGetExtkeyInfo(in_stack_fffffffffffffaf8.data_,
                                  (char *)in_stack_fffffffffffffaf0.ptr_,in_stack_fffffffffffffae8,
                                  (char **)in_stack_fffffffffffffae0.ptr_,
                                  (char **)in_stack_fffffffffffffad8.data_,in_stack_fffffffffffffad0
                                  ,in_stack_fffffffffffffb10,(int *)in_stack_fffffffffffffb18.ptr_,
                                  (int *)in_stack_fffffffffffffb20.data_);
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
                 (CfdErrorCode *)lhs,piVar3);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_428);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffbc8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36ef19);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffbc0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x293,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffbc0,(Message *)&stack0xfffffffffffffbc8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc0);
        testing::Message::~Message((Message *)0x36ef7c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36efd1);
      testing::internal::EqHelper<false>::Compare<CfdExtKeyType,int>
                ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,lhs,piVar3);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffbb0);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffba0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36f07e);
        testing::internal::AssertHelper::AssertHelper
                  (&local_468,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x294,pcVar2);
        testing::internal::AssertHelper::operator=(&local_468,(Message *)&stack0xfffffffffffffba0);
        testing::internal::AssertHelper::~AssertHelper(&local_468);
        testing::Message::~Message((Message *)0x36f0e1);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36f136);
      local_47c = 0;
      testing::internal::EqHelper<false>::Compare<CfdNetworkType,int>
                ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,lhs,piVar3);
      uVar4 = (undefined4)((ulong)piVar3 >> 0x20);
      uVar5 = (undefined4)((ulong)lhs >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_478);
      if (!bVar1) {
        testing::Message::Message(&local_488);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36f1e3);
        testing::internal::AssertHelper::AssertHelper
                  (&local_490,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x295,pcVar2);
        testing::internal::AssertHelper::operator=(&local_490,&local_488);
        testing::internal::AssertHelper::~AssertHelper(&local_490);
        testing::Message::~Message((Message *)0x36f246);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36f29e);
      local_498 = (char *)0x0;
      rhs_expression = &local_498;
      lhs_00 = (CfdErrorCode *)CONCAT44(uVar5,local_338);
      piVar3 = (int *)(CONCAT44(uVar4,local_334) & 0xffffffff000000ff);
      local_14 = CfdCreateExtkey(in_stack_fffffffffffffd48.ptr_,in_stack_fffffffffffffd44,
                                 in_stack_fffffffffffffd40,
                                 (char *)CONCAT44(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38),
                                 (char *)in_stack_fffffffffffffd30.ptr_,
                                 (char *)in_stack_fffffffffffffd28.data_,in_stack_fffffffffffffd60,
                                 in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
                                 (char **)in_stack_fffffffffffffd78.ptr_);
      local_4ac = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff738,(char *)rhs_expression,lhs_00,piVar3);
      uVar4 = (undefined4)((ulong)piVar3 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
      if (!bVar1) {
        testing::Message::Message(&local_4b8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36f3b0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x29b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
        testing::internal::AssertHelper::~AssertHelper(&local_4c0);
        testing::Message::~Message((Message *)0x36f413);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36f468);
      if (local_14 == 0) {
        in_stack_fffffffffffff7b8 = &local_4d0;
        testing::internal::CmpHelperSTREQ
                  ((internal *)in_stack_fffffffffffff7b8,"extprivkey3","get_extkey",local_c8,
                   local_498);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff7b8);
        if (!bVar1) {
          testing::Message::Message(&local_4d8);
          in_stack_fffffffffffff7b0 =
               (char **)testing::AssertionResult::failure_message((AssertionResult *)0x36f518);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffb20,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                     ,0x29d,(char *)in_stack_fffffffffffff7b0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffb20,&local_4d8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb20);
          testing::Message::~Message((Message *)0x36f57b);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x36f5d0);
        CfdFreeStringBuffer((char *)lhs_00);
        local_498 = (char *)0x0;
      }
      in_stack_fffffffffffff730 = &local_498;
      in_stack_fffffffffffff728 = (CfdErrorCode *)CONCAT44((int)((ulong)lhs_00 >> 0x20),local_338);
      in_stack_fffffffffffff720 =
           (AssertionResult *)(CONCAT44(uVar4,local_334) & 0xffffffff000000ff);
      local_14 = CfdCreateExtkey(in_stack_fffffffffffffd48.ptr_,in_stack_fffffffffffffd44,
                                 in_stack_fffffffffffffd40,
                                 (char *)CONCAT44(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38),
                                 (char *)in_stack_fffffffffffffd30.ptr_,
                                 (char *)in_stack_fffffffffffffd28.data_,in_stack_fffffffffffffd60,
                                 in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
                                 (char **)in_stack_fffffffffffffd78.ptr_);
      local_4f4 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
                 in_stack_fffffffffffff728,(int *)in_stack_fffffffffffff720);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffb10);
      if (!bVar1) {
        testing::Message::Message(&local_500);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36f6f4);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffaf8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x2a5,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffaf8,&local_500);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffaf8);
        testing::Message::~Message((Message *)0x36f757);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36f7ac);
      if (local_14 == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&stack0xfffffffffffffae8,
                   "\"xpub6EXtjFtcPwmae296sZGckBgbfCHnodfjWujbGK7hhzRybmWJhmgeusFbiiZyG1iSeiBcQ7diPeUC9vtP9wLS44bWpqH4kuQQD5N4gA3LaFE\""
                   ,"get_extkey",
                   "xpub6EXtjFtcPwmae296sZGckBgbfCHnodfjWujbGK7hhzRybmWJhmgeusFbiiZyG1iSeiBcQ7diPeUC9vtP9wLS44bWpqH4kuQQD5N4gA3LaFE"
                   ,local_498);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffffae8);
        if (!bVar1) {
          testing::Message::Message((Message *)&stack0xfffffffffffffae0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36f84f);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffad8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                     ,0x2a7,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffad8,(Message *)&stack0xfffffffffffffae0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffad8);
          testing::Message::~Message((Message *)0x36f8ac);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x36f901);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
        local_498 = (char *)0x0;
      }
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
    }
  }
  CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
  CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
  CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
  CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
  CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
  CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
  CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
  CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
  CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffff758);
  if (local_14 != 0) {
    pcVar2 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
    local_544 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
               in_stack_fffffffffffff728,(int *)in_stack_fffffffffffff720);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_540);
    if (!bVar1) {
      testing::Message::Message(&local_550);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x36faa5);
      testing::internal::AssertHelper::AssertHelper
                (&local_558,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x2c0,message);
      testing::internal::AssertHelper::operator=(&local_558,&local_550);
      testing::internal::AssertHelper::~AssertHelper(&local_558);
      testing::Message::~Message((Message *)0x36fb02);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36fb57);
    pAVar6 = &local_568;
    testing::internal::CmpHelperSTREQ((internal *)pAVar6,"\"\"","str_buffer","",pcVar2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
    if (!bVar1) {
      testing::Message::Message(&local_570);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36fbec);
      testing::internal::AssertHelper::AssertHelper
                (&local_578,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x2c1,pcVar2);
      testing::internal::AssertHelper::operator=(&local_578,&local_570);
      testing::internal::AssertHelper::~AssertHelper(&local_578);
      testing::Message::~Message((Message *)0x36fc49);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36fc9e);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff728);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffff728);
  local_58c = 0;
  pAVar6 = &local_588;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,
             in_stack_fffffffffffff728,(int *)in_stack_fffffffffffff720);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36fd6e);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x2c7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    testing::Message::~Message((Message *)0x36fdcb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36fe20);
  return;
}

Assistant:

TEST(cfdcapi_key, ExtkeyTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static constexpr const char* kSeed = "0e09fbdd00e575b654d480ae979f24da45ef4dee645c7dc2e3b30b2e093d38dda0202357754cc856f8920b8e31dd02e9d34f6a2b20dc825c6ba90f90009085e1";
  static constexpr const int kNetwork = kCfdNetworkMainnet;

  char* pubkey = nullptr;
  char* privkey = nullptr;
  char* wif = nullptr;
  char* extprivkey1 = nullptr;
  char* extprivkey2 = nullptr;
  char* extprivkey3 = nullptr;
  char* extprivkey4 = nullptr;
  char* extpubkey1 = nullptr;
  char* key_path_data = nullptr;
  ret = CfdCreateExtkeyFromSeed(
      handle, kSeed, kNetwork, kCfdExtPrivkey, &extprivkey1);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("xprv9s21ZrQH143K38XAstQ4D3hCGbgydJgNff6CcwmkrWTBxksb2G4CsqAywJCKbTdywfCpmpJyxqf77iKK1ju1J982iP2PriifaNZLMbyPQCx", extprivkey1);

    ret = CfdCreateExtkeyFromParent(handle, extprivkey1, 44, true,
        kNetwork, kCfdExtPrivkey, &extprivkey2);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("xprv9tviYANkXM1CY831VtMFKFn6LP6aMHf1kvtCZyTL9YbyMwTR2BSmJaEoqw59BZdQhLSx9ZxyKsRUeCetxA2xZ34eupBqZUsifnWyLJJ16j3", extprivkey2);

    ret = CfdCreateExtPubkey(handle, extprivkey2, kNetwork,
        &extpubkey1);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2", extpubkey1);

    ret = CfdCreateExtkeyFromParentPath(handle, extprivkey2, "0h/0h/2",
        kNetwork, kCfdExtPrivkey, &extprivkey3);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("xprvA1YYKkMiZaDHRY4dmXjcP3js7ATJQAwt9gozTvi69etziyBAAENQN4w7sS3uBaF7rgXvP3sUtKFju7p3PosjNkRDuqqSFfxTjjEhgx6ejVZ", extprivkey3);

    ret = CfdGetPrivkeyFromExtkey(handle, extprivkey3,
        kNetwork, &privkey, &wif);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("597da1afc4218445ba9428c1c790a30fd21d5c4a932fa580b99dda7ec0887472", privkey);
    EXPECT_STREQ("KzDfmSzt1XqZh5m4sQPBqhpiTGncQ2xvXuWnKGMqR9gVHGSbVJP2", wif);

    ret = CfdGetPubkeyFromExtkey(handle, extprivkey3,
        kNetwork, &pubkey);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("031d7463018f867de51a27db866f869ceaf52abab71827a6051bab8a0fd020f4c1", pubkey);

    ret = CfdGetParentExtkeyPathData(
        handle, extprivkey2, "0h/0h/2", kCfdExtPrivkey, &key_path_data, &extprivkey4);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("[03af54a0/0h/0h/2]", key_path_data);
    EXPECT_STREQ(extprivkey3, extprivkey4);

    char* version = nullptr;
    char* fingerprint = nullptr;
    char* chain_code = nullptr;
    uint32_t depth = 0;
    uint32_t child_number = 0;
    ret = CfdGetExtkeyInformation(handle, extprivkey3, &version,
        &fingerprint, &chain_code, &depth, &child_number);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0488ade4", version);
      EXPECT_STREQ("8806118d", fingerprint);
      EXPECT_STREQ("a3d58c40ac9c588529edb6cf9576241a6c2c919843bd97c3c26b35538d91a292", chain_code);
      EXPECT_EQ(4, depth);
      EXPECT_EQ(2, child_number);

      int net_type = 0;
      int key_type = 0;
      ret = CfdGetExtkeyInfo(handle, extprivkey3, nullptr, nullptr, nullptr,
          &depth, &child_number, &key_type, &net_type);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(kCfdExtPrivkey, key_type);
      EXPECT_EQ(kCfdNetworkMainnet, net_type);

      char* get_extkey = nullptr;
      ret = CfdCreateExtkey(handle, kNetwork, kCfdExtPrivkey, nullptr,
          fingerprint, privkey, chain_code,
          static_cast<unsigned char>(depth), child_number, &get_extkey);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ(extprivkey3, get_extkey);
        CfdFreeStringBuffer(get_extkey);
        get_extkey = nullptr;
      }

      ret = CfdCreateExtkey(handle, kNetwork, kCfdExtPubkey, nullptr,
          fingerprint, pubkey, chain_code,
          static_cast<unsigned char>(depth), child_number, &get_extkey);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("xpub6EXtjFtcPwmae296sZGckBgbfCHnodfjWujbGK7hhzRybmWJhmgeusFbiiZyG1iSeiBcQ7diPeUC9vtP9wLS44bWpqH4kuQQD5N4gA3LaFE", get_extkey);
        CfdFreeStringBuffer(get_extkey);
        get_extkey = nullptr;
      }

      CfdFreeStringBuffer(version);
      CfdFreeStringBuffer(fingerprint);
      CfdFreeStringBuffer(chain_code);
    }
  }

  CfdFreeStringBuffer(extprivkey1);
  CfdFreeStringBuffer(extprivkey2);
  CfdFreeStringBuffer(extprivkey3);
  CfdFreeStringBuffer(extprivkey4);
  CfdFreeStringBuffer(key_path_data);
  CfdFreeStringBuffer(extpubkey1);
  CfdFreeStringBuffer(privkey);
  CfdFreeStringBuffer(wif);
  CfdFreeStringBuffer(pubkey);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}